

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManCollectTopXors_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXors)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_30;
  Gia_Obj_t *local_28;
  
  iVar1 = Gia_ObjId(p,pObj);
  iVar2 = Gia_ObjRecognizeExor(pObj,&local_28,&local_30);
  if (iVar2 == 0) {
    uVar3 = (uint)*(ulong *)pObj;
    uVar4 = *(ulong *)pObj & 0x1fffffff;
    if (-1 < (int)uVar3 && uVar4 != 0x1fffffff) {
      if ((uVar3 >> 0x1d & 1) == 0) {
        Gia_ManCollectTopXors_rec(p,pObj + -uVar4,vXors);
      }
      else {
        Vec_IntPushUnique(vXors,iVar1 - (uVar3 & 0x1fffffff));
      }
      uVar3 = (uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff;
      if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
        Gia_ManCollectTopXors_rec(p,pObj + -(ulong)uVar3,vXors);
        return;
      }
      iVar1 = iVar1 - uVar3;
      goto LAB_001e0aa8;
    }
  }
  iVar1 = Gia_ObjId(p,pObj);
LAB_001e0aa8:
  Vec_IntPushUnique(vXors,iVar1);
  return;
}

Assistant:

void Gia_ManCollectTopXors_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXors )
{
    Gia_Obj_t * pFan0, * pFan1;
    int iObj = Gia_ObjId( p, pObj );
    if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) || !Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vXors, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjFaninC0(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId0(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin0(pObj), vXors );
    if ( Gia_ObjFaninC1(pObj) )
        Vec_IntPushUnique( vXors, Gia_ObjFaninId1(pObj, iObj) );
    else
        Gia_ManCollectTopXors_rec( p, Gia_ObjFanin1(pObj), vXors );
}